

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_connect(lysc_ctx *ctx,lysc_node *parent,lysc_node *node)

{
  long lVar1;
  int iVar2;
  LY_ERR LVar3;
  bool bVar4;
  lysc_node_action **local_48;
  lysc_node **list;
  lysc_node *plStack_38;
  int insert_after;
  lysc_node *anchor;
  lysc_node **children;
  lysc_node *node_local;
  lysc_node *parent_local;
  lysc_ctx *ctx_local;
  
  plStack_38 = (lysc_node *)0x0;
  list._4_4_ = 0;
  node->parent = parent;
  children = (lysc_node **)node;
  node_local = parent;
  parent_local = (lysc_node *)ctx;
  if (parent == (lysc_node *)0x0) {
    local_48 = (lysc_node_action **)0x0;
    if (ctx->ext == (lysc_ext_instance *)0x0) {
      if (node->nodetype == 0x100) {
        local_48 = &ctx->cur_mod->compiled->rpcs;
      }
      else if (node->nodetype == 0x400) {
        local_48 = (lysc_node_action **)&ctx->cur_mod->compiled->notifs;
      }
      else {
        local_48 = (lysc_node_action **)&ctx->cur_mod->compiled->data;
      }
    }
    else {
      lyplg_ext_get_storage_p(ctx->ext,0x7760,&local_48);
    }
    if (*local_48 == (lysc_node_action *)0x0) {
      *local_48 = (lysc_node_action *)children;
    }
    else {
      (((*local_48)->field_0).node.prev)->next = (lysc_node *)children;
      children[4] = ((*local_48)->field_0).node.prev;
      ((*local_48)->field_0).node.prev = (lysc_node *)children;
    }
    LVar3 = lys_compile_node_uniqness
                      ((lysc_ctx *)parent_local,(lysc_node *)0x0,(char *)children[5],
                       (lysc_node *)children);
    if (LVar3 != LY_SUCCESS) {
      return LY_EEXIST;
    }
  }
  else {
    if (node->nodetype == 0x1000) {
      if ((parent->nodetype & 0x300) != 0) {
        node->next = (lysc_node *)&parent[2].next;
        node->prev = node->next;
        return LY_SUCCESS;
      }
      __assert_fail("parent->nodetype & (LYS_ACTION | LYS_RPC)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                    ,0x9bb,
                    "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                   );
    }
    if (node->nodetype == 0x2000) {
      node->next = (lysc_node *)0x0;
      node->prev = (lysc_node *)&parent[1].module;
      return LY_SUCCESS;
    }
    if (node->nodetype == 0x200) {
      anchor = (lysc_node *)lysc_node_actions_p(parent);
    }
    else if (node->nodetype == 0x400) {
      anchor = (lysc_node *)lysc_node_notifs_p(parent);
    }
    else {
      anchor = (lysc_node *)lysc_node_child_p(parent);
    }
    if (anchor == (lysc_node *)0x0) {
      __assert_fail("children",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                    ,0x9cc,
                    "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                   );
    }
    lVar1._0_2_ = anchor->nodetype;
    lVar1._2_2_ = anchor->flags;
    lVar1._4_1_ = anchor->hash[0];
    lVar1._5_1_ = anchor->hash[1];
    lVar1._6_1_ = anchor->hash[2];
    lVar1._7_1_ = anchor->hash[3];
    if (lVar1 == 0) {
      *(lysc_node ***)anchor = children;
    }
    else if (((ulong)*children & 0x1000000) == 0) {
      if (*(lysc_node **)(*(long *)(*(long *)anchor + 0x20) + 8) == children[1]) {
        plStack_38 = *(lysc_node **)(*(long *)anchor + 0x20);
        list._4_4_ = 1;
      }
      else if (node_local->module == (lys_module *)children[1]) {
        for (plStack_38 = *(lysc_node **)anchor; plStack_38->module == (lys_module *)children[1];
            plStack_38 = plStack_38->next) {
        }
      }
      else {
        plStack_38 = *(lysc_node **)anchor;
        do {
          plStack_38 = plStack_38->prev;
          if (((plStack_38->module == (lys_module *)children[1]) ||
              (iVar2 = strcmp(plStack_38->module->name,(char *)children[1]->module), iVar2 < 0)) ||
             (plStack_38->module == node_local->module)) {
            list._4_4_ = 1;
            break;
          }
        } while (plStack_38->prev->next != (lysc_node *)0x0);
      }
    }
    else {
      if ((lys_module *)children[1] != node_local->module) {
        __assert_fail("node->module == parent->module",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x9d3,
                      "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                     );
      }
      plStack_38 = *(lysc_node **)anchor;
      if ((plStack_38->flags & 0x100) != 0) {
        while( true ) {
          bVar4 = false;
          if ((plStack_38->flags & 0x100) != 0) {
            bVar4 = plStack_38->next != (lysc_node *)0x0;
          }
          if (!bVar4) break;
          plStack_38 = plStack_38->next;
        }
        list._4_4_ = 1;
      }
    }
    if (plStack_38 != (lysc_node *)0x0) {
      if (list._4_4_ == 0) {
        children[3] = plStack_38;
        children[4] = plStack_38->prev;
        plStack_38->prev = (lysc_node *)children;
        if (plStack_38 == *(lysc_node **)anchor) {
          *(lysc_node ***)anchor = children;
        }
        else {
          children[4]->next = (lysc_node *)children;
        }
      }
      else {
        children[3] = plStack_38->next;
        children[4] = plStack_38;
        plStack_38->next = (lysc_node *)children;
        if (children[3] == (lysc_node *)0x0) {
          *(lysc_node ***)(*(long *)anchor + 0x20) = children;
        }
        else {
          children[3]->prev = (lysc_node *)children;
        }
      }
    }
    LVar3 = lys_compile_node_uniqness
                      ((lysc_ctx *)parent_local,node_local,(char *)children[5],(lysc_node *)children
                      );
    if (LVar3 != LY_SUCCESS) {
      return LY_EEXIST;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_compile_node_connect(struct lysc_ctx *ctx, struct lysc_node *parent, struct lysc_node *node)
{
    struct lysc_node **children, *anchor = NULL;
    int insert_after = 0;

    node->parent = parent;

    if (parent) {
        if (node->nodetype == LYS_INPUT) {
            assert(parent->nodetype & (LYS_ACTION | LYS_RPC));
            /* input node is part of the action but link it with output */
            node->next = &((struct lysc_node_action *)parent)->output.node;
            node->prev = node->next;
            return LY_SUCCESS;
        } else if (node->nodetype == LYS_OUTPUT) {
            /* output node is part of the action but link it with input */
            node->next = NULL;
            node->prev = &((struct lysc_node_action *)parent)->input.node;
            return LY_SUCCESS;
        } else if (node->nodetype == LYS_ACTION) {
            children = (struct lysc_node **)lysc_node_actions_p(parent);
        } else if (node->nodetype == LYS_NOTIF) {
            children = (struct lysc_node **)lysc_node_notifs_p(parent);
        } else {
            children = lysc_node_child_p(parent);
        }
        assert(children);

        if (!(*children)) {
            /* first child */
            *children = node;
        } else if (node->flags & LYS_KEY) {
            /* special handling of adding keys */
            assert(node->module == parent->module);
            anchor = *children;
            if (anchor->flags & LYS_KEY) {
                while ((anchor->flags & LYS_KEY) && anchor->next) {
                    anchor = anchor->next;
                }
                /* insert after the last key */
                insert_after = 1;
            } /* else insert before anchor (at the beginning) */
        } else if ((*children)->prev->module == node->module) {
            /* last child is from the same module, keep the order and insert at the end */
            anchor = (*children)->prev;
            insert_after = 1;
        } else if (parent->module == node->module) {
            /* adding module child after some augments were connected */
            for (anchor = *children; anchor->module == node->module; anchor = anchor->next) {}
        } else {
            /* some augments are already connected and we are connecting new ones,
             * keep module name order and insert the node into the children list */
            anchor = *children;
            do {
                anchor = anchor->prev;

                /* check that we have not found the last augment node from our module or
                 * the first augment node from a "smaller" module or
                 * the first node from a local module */
                if ((anchor->module == node->module) || (strcmp(anchor->module->name, node->module->name) < 0) ||
                        (anchor->module == parent->module)) {
                    /* insert after */
                    insert_after = 1;
                    break;
                }

                /* we have traversed all the nodes, insert before anchor (as the first node) */
            } while (anchor->prev->next);
        }

        /* insert */
        if (anchor) {
            if (insert_after) {
                node->next = anchor->next;
                node->prev = anchor;
                anchor->next = node;
                if (node->next) {
                    /* middle node */
                    node->next->prev = node;
                } else {
                    /* last node */
                    (*children)->prev = node;
                }
            } else {
                node->next = anchor;
                node->prev = anchor->prev;
                anchor->prev = node;
                if (anchor == *children) {
                    /* first node */
                    *children = node;
                } else {
                    /* middle node */
                    node->prev->next = node;
                }
            }
        }

        /* check the name uniqueness (even for an only child, it may be in case) */
        if (lys_compile_node_uniqness(ctx, parent, node->name, node)) {
            return LY_EEXIST;
        }
    } else {
        /* top-level element */
        struct lysc_node **list = NULL;

        if (ctx->ext) {
            lyplg_ext_get_storage_p(ctx->ext, LY_STMT_DATA_NODE_MASK, (void ***)&list);
        } else if (node->nodetype == LYS_RPC) {
            list = (struct lysc_node **)&ctx->cur_mod->compiled->rpcs;
        } else if (node->nodetype == LYS_NOTIF) {
            list = (struct lysc_node **)&ctx->cur_mod->compiled->notifs;
        } else {
            list = &ctx->cur_mod->compiled->data;
        }
        if (!(*list)) {
            *list = node;
        } else {
            /* insert at the end of the module's top-level nodes list */
            (*list)->prev->next = node;
            node->prev = (*list)->prev;
            (*list)->prev = node;
        }

        /* check the name uniqueness on top-level */
        if (lys_compile_node_uniqness(ctx, NULL, node->name, node)) {
            return LY_EEXIST;
        }
    }

    return LY_SUCCESS;
}